

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip_source_pkware_encode.c
# Opt level: O3

zip_int64_t
pkware_encrypt(zip_source_t *src,void *ud,void *data,zip_uint64_t length,zip_source_cmd_t cmd)

{
  zip_pkware_keys_t *keys;
  _Bool _Var1;
  size_t len;
  zip_buffer_t *buffer;
  zip_uint8_t *pzVar2;
  zip_uint64_t zVar3;
  zip_int64_t zVar4;
  ulong uVar5;
  int ze;
  zip_file_attributes_t *attributes;
  
  switch(cmd) {
  case ZIP_SOURCE_OPEN:
    *(undefined1 *)((long)ud + 0x20) = 0;
    keys = (zip_pkware_keys_t *)((long)ud + 8);
    _zip_pkware_keys_reset(keys);
    pzVar2 = *ud;
    len = strlen((char *)pzVar2);
    _zip_pkware_encrypt(keys,(zip_uint8_t *)0x0,pzVar2,len);
    buffer = _zip_buffer_new((zip_uint8_t *)0x0,0xc);
    *(zip_buffer_t **)((long)ud + 0x18) = buffer;
    if (buffer != (zip_buffer_t *)0x0) {
      pzVar2 = _zip_buffer_data(buffer);
      _Var1 = zip_secure_random(pzVar2,0xb);
      if (!_Var1) {
        zip_error_set((zip_error_t *)((long)ud + 0x28),0x14,0);
        _zip_buffer_free(*(zip_buffer_t **)((long)ud + 0x18));
        *(undefined8 *)((long)ud + 0x18) = 0;
        return -1;
      }
      pzVar2[0xb] = *(zip_uint8_t *)((long)ud + 0x23);
      _zip_pkware_encrypt(keys,pzVar2,pzVar2,0xc);
      return 0;
    }
    ze = 0xe;
    goto LAB_00110ee3;
  case ZIP_SOURCE_READ:
    if (*(zip_buffer_t **)((long)ud + 0x18) == (zip_buffer_t *)0x0) {
      zVar3 = 0;
    }
    else {
      zVar3 = _zip_buffer_read(*(zip_buffer_t **)((long)ud + 0x18),(zip_uint8_t *)data,length);
      data = (void *)((long)data + zVar3);
      length = length - zVar3;
      _Var1 = _zip_buffer_eof(*(zip_buffer_t **)((long)ud + 0x18));
      if (_Var1) {
        _zip_buffer_free(*(zip_buffer_t **)((long)ud + 0x18));
        *(undefined8 *)((long)ud + 0x18) = 0;
      }
    }
    if (*(char *)((long)ud + 0x20) == '\0') {
      uVar5 = zip_source_read(src,data,length);
      if ((long)uVar5 < 0) {
        zip_error_set_from_source((zip_error_t *)((long)ud + 0x28),src);
        return -1;
      }
      _zip_pkware_encrypt((zip_pkware_keys_t *)((long)ud + 8),(zip_uint8_t *)data,
                          (zip_uint8_t *)data,uVar5);
      if (uVar5 < length) {
        *(undefined1 *)((long)ud + 0x20) = 1;
      }
      return zVar3 + uVar5;
    }
    return zVar3;
  case ZIP_SOURCE_CLOSE:
    _zip_buffer_free(*(zip_buffer_t **)((long)ud + 0x18));
    *(undefined8 *)((long)ud + 0x18) = 0;
    break;
  case ZIP_SOURCE_STAT:
    *(undefined2 *)((long)data + 0x36) = 1;
    uVar5 = *data;
    *(ulong *)data = uVar5 | 0x80;
    if ((uVar5 & 8) != 0) {
      *(long *)((long)data + 0x20) = *(long *)((long)data + 0x20) + 0xc;
    }
    break;
  case ZIP_SOURCE_ERROR:
    zVar4 = zip_error_to_data((zip_error_t *)((long)ud + 0x28),data,length);
    return zVar4;
  case ZIP_SOURCE_FREE:
    trad_pkware_free((trad_pkware_conflict *)ud);
    break;
  default:
    zVar4 = zip_source_pass_to_lower_layer(src,data,length,cmd);
    return zVar4;
  case ZIP_SOURCE_SUPPORTS:
    zVar4 = zip_source_make_command_bitmap(ZIP_SOURCE_OPEN,1,2,3,4,5,0x13,0x15,0xffffffffffffffff);
    return zVar4;
  case ZIP_SOURCE_GET_FILE_ATTRIBUTES:
    if (0x17 < length) {
      *(byte *)data = *data | 0x14;
      *(undefined1 *)((long)data + 0xb) = 0x14;
      *(undefined4 *)((long)data + 0x10) = 0x80008;
      return 0;
    }
    goto LAB_00110e9c;
  case ZIP_SOURCE_GET_DOS_TIME:
    if (3 < length) {
      *(undefined4 *)data = *(undefined4 *)((long)ud + 0x22);
      return 4;
    }
LAB_00110e9c:
    ze = 0x12;
LAB_00110ee3:
    zip_error_set((zip_error_t *)((long)ud + 0x28),ze,0);
    return -1;
  }
  return 0;
}

Assistant:

static zip_int64_t
pkware_encrypt(zip_source_t *src, void *ud, void *data, zip_uint64_t length, zip_source_cmd_t cmd) {
    struct trad_pkware *ctx;
    zip_int64_t n;
    zip_uint64_t buffer_n;

    ctx = (struct trad_pkware *)ud;

    switch (cmd) {
    case ZIP_SOURCE_OPEN:
        ctx->eof = false;

        /* initialize keys */
        _zip_pkware_keys_reset(&ctx->keys);
        _zip_pkware_encrypt(&ctx->keys, NULL, (const zip_uint8_t *)ctx->password, strlen(ctx->password));

        if (encrypt_header(src, ctx) < 0) {
            return -1;
        }
        return 0;

    case ZIP_SOURCE_READ:
        buffer_n = 0;

        if (ctx->buffer) {
            /* write header values to data */
            buffer_n = _zip_buffer_read(ctx->buffer, data, length);
            data = (zip_uint8_t *)data + buffer_n;
            length -= buffer_n;

            if (_zip_buffer_eof(ctx->buffer)) {
                _zip_buffer_free(ctx->buffer);
                ctx->buffer = NULL;
            }
        }

        if (ctx->eof) {
            return (zip_int64_t)buffer_n;
        }

        if ((n = zip_source_read(src, data, length)) < 0) {
            zip_error_set_from_source(&ctx->error, src);
            return -1;
        }

        _zip_pkware_encrypt(&ctx->keys, (zip_uint8_t *)data, (zip_uint8_t *)data, (zip_uint64_t)n);

        if ((zip_uint64_t)n < length) {
            ctx->eof = true;
        }

        return (zip_int64_t)buffer_n + n;

    case ZIP_SOURCE_CLOSE:
        _zip_buffer_free(ctx->buffer);
        ctx->buffer = NULL;
        return 0;

    case ZIP_SOURCE_STAT: {
        zip_stat_t *st;

        st = (zip_stat_t *)data;
        st->encryption_method = ZIP_EM_TRAD_PKWARE;
        st->valid |= ZIP_STAT_ENCRYPTION_METHOD;
        if (st->valid & ZIP_STAT_COMP_SIZE) {
            st->comp_size += ZIP_CRYPTO_PKWARE_HEADERLEN;
        }

        return 0;
    }

    case ZIP_SOURCE_GET_FILE_ATTRIBUTES: {
        zip_file_attributes_t *attributes = (zip_file_attributes_t *)data;
        if (length < sizeof(*attributes)) {
            zip_error_set(&ctx->error, ZIP_ER_INVAL, 0);
            return -1;
        }
        attributes->valid |= ZIP_FILE_ATTRIBUTES_VERSION_NEEDED | ZIP_FILE_ATTRIBUTES_GENERAL_PURPOSE_BIT_FLAGS;
        attributes->version_needed = 20;
        attributes->general_purpose_bit_flags = ZIP_GPBF_DATA_DESCRIPTOR;
        attributes->general_purpose_bit_mask = ZIP_GPBF_DATA_DESCRIPTOR;

        return 0;
    }

    case ZIP_SOURCE_GET_DOS_TIME:
        if (length < sizeof(ctx->dostime)) {
            zip_error_set(&ctx->error, ZIP_ER_INVAL, 0);
            return -1;
        }
        (void)memcpy_s(data, sizeof(ctx->dostime), &ctx->dostime, sizeof(ctx->dostime));
        return sizeof(ctx->dostime);

    case ZIP_SOURCE_SUPPORTS:
        return zip_source_make_command_bitmap(ZIP_SOURCE_OPEN, ZIP_SOURCE_READ, ZIP_SOURCE_CLOSE, ZIP_SOURCE_STAT, ZIP_SOURCE_ERROR, ZIP_SOURCE_FREE, ZIP_SOURCE_GET_FILE_ATTRIBUTES, ZIP_SOURCE_GET_DOS_TIME, -1);

    case ZIP_SOURCE_ERROR:
        return zip_error_to_data(&ctx->error, data, length);

    case ZIP_SOURCE_FREE:
        trad_pkware_free(ctx);
        return 0;

    default:
        return zip_source_pass_to_lower_layer(src, data, length, cmd);
    }
}